

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

_Bool ggml_thread_apply_affinity(_Bool *mask)

{
  FILE *__stream;
  uint __errnum;
  pthread_t __th;
  char *pcVar1;
  long in_RDI;
  size_t __cpu;
  uint32_t i;
  int err;
  cpu_set_t cpuset;
  uint local_98;
  cpu_set_t local_90;
  long local_10;
  
  local_10 = in_RDI;
  memset(&local_90,0,0x80);
  for (local_98 = 0; local_98 < 0x200; local_98 = local_98 + 1) {
    if (((*(byte *)(local_10 + (ulong)local_98) & 1) != 0) && (local_98 >> 3 < 0x80)) {
      local_90.__bits[local_98 >> 6] =
           1L << ((byte)local_98 & 0x3f) | local_90.__bits[local_98 >> 6];
    }
  }
  __th = pthread_self();
  __errnum = pthread_setaffinity_np(__th,0x80,&local_90);
  __stream = _stderr;
  if (__errnum != 0) {
    pcVar1 = strerror(__errnum);
    fprintf(__stream,"warn: failed to set affinity mask 0x%llx : %s (%d)\n",local_10,pcVar1,
            (ulong)__errnum);
  }
  return __errnum == 0;
}

Assistant:

static bool ggml_thread_apply_affinity(const bool * mask) {
    cpu_set_t cpuset;
    int err;

    CPU_ZERO(&cpuset);

    for (uint32_t i = 0; i < GGML_MAX_N_THREADS; i++) {
        if (mask[i]) {
            GGML_PRINT_DEBUG("Thread %lx: adding %d to cpuset\n", pthread_self(), i);
            CPU_SET(i, &cpuset);
        }
    }

#ifdef __ANDROID__
    err = sched_setaffinity(0, sizeof(cpuset), &cpuset);
    if (err < 0) {
        err = errno;
    }
#else
    err = pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
    if (err != 0) {
        fprintf(stderr, "warn: failed to set affinity mask 0x%llx : %s (%d)\n", (unsigned long long)mask, strerror(err), err);
        return false;
    }

    return true;
}